

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.cpp
# Opt level: O0

void __thiscall log::openFile(log *this,string *name)

{
  ofstream *poVar1;
  ulong uVar2;
  ofstream *tmp;
  string *name_local;
  log *this_local;
  
  poVar1 = (ofstream *)operator_new(0x200);
  std::ofstream::ofstream(poVar1,name,0x10);
  uVar2 = std::ofstream::is_open();
  if ((uVar2 & 1) != 0) {
    std::ofstream::close();
    this->_file = (ofstream *)poVar1;
  }
  return;
}

Assistant:

void log::openFile(std::string &name) {
    std::ofstream *tmp = new std::ofstream(name);
    if (tmp->is_open()){
        _file->close();
        _file = tmp;
    }
}